

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  int iVar2;
  _Alloc_hider _Var3;
  SectionTracker *pSVar4;
  ITrackerPtr childTracker;
  undefined1 local_49;
  value_type local_48;
  SectionTracker *local_38;
  _Alloc_hider local_30;
  ITracker *local_28;
  
  pIVar1 = ctx->m_currentTracker;
  ITracker::findChild((ITracker *)&stack0xffffffffffffffc8,(NameAndLocation *)pIVar1);
  if (local_38 == (SectionTracker *)0x0) {
    local_48.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_28 = pIVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestCaseTracking::SectionTracker,std::allocator<Catch::TestCaseTracking::SectionTracker>,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              (&local_48.
                super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(SectionTracker **)&local_48,
               (allocator<Catch::TestCaseTracking::SectionTracker> *)&local_49,nameAndLocation,ctx,
               &stack0xffffffffffffffd8);
    _Var3._M_p = (pointer)local_48.
                          super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
    pSVar4 = (SectionTracker *)
             local_48.
             super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (local_48.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.
              super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.
              super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
    ::push_back(&pIVar1->m_children,&local_48);
    if (local_48.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    iVar2 = (*(local_38->super_TrackerBase).super_ITracker._vptr_ITracker[0xb])(local_38);
    if ((char)iVar2 == '\0') {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                    ,0x15b1,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const NameAndLocation &)"
                   );
    }
    pSVar4 = local_38;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_p ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var3._M_p = (pointer)0x0;
    }
    else {
      _Var3._M_p = local_30._M_p;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_30._M_p + 8) = *(int *)(local_30._M_p + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_30._M_p + 8) = *(int *)(local_30._M_p + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_p);
  }
  if (ctx->m_runState != CompletedCycle) {
    iVar2 = (*(pSVar4->super_TrackerBase).super_ITracker._vptr_ITracker[2])(pSVar4);
    if ((char)iVar2 == '\0') {
      (pSVar4->super_TrackerBase).m_runState = Executing;
      ((pSVar4->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)pSVar4;
      pIVar1 = (pSVar4->super_TrackerBase).m_parent;
      if (pIVar1 != (ITracker *)0x0) {
        (*pIVar1->_vptr_ITracker[10])();
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p);
  }
  return pSVar4;
}

Assistant:

SectionTracker &SectionTracker::acquire(TrackerContext &ctx, NameAndLocation const &nameAndLocation) {
            std::shared_ptr<SectionTracker> section;

            ITracker &currentTracker = ctx.currentTracker();
            if (ITrackerPtr childTracker = currentTracker.findChild(nameAndLocation)) {
                assert(childTracker);
                assert(childTracker->isSectionTracker());
                section = std::static_pointer_cast<SectionTracker>(childTracker);
            }
            else {
                section = std::make_shared<SectionTracker>(nameAndLocation, ctx, &currentTracker);
                currentTracker.addChild(section);
            }
            if (!ctx.completedCycle())
                section->tryOpen();
            return *section;
        }